

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_lookup_path_modify(Tree *this,lookup_result *r)

{
  size_t sVar1;
  csubstr cVar2;
  _lookup_path_token parent;
  _lookup_path_token local_38;
  
  cVar2 = lookup_result::unresolved(r);
  if ((cVar2.len == 0) || (cVar2.str == (char *)0x0)) {
    _lookup_path_modify();
  }
  local_38.type = type(this,r->closest);
  local_38.value.str = "";
  local_38.value.len = 0;
  while( true ) {
    sVar1 = _next_node_modify(this,r,&local_38);
    if (sVar1 != 0xffffffffffffffff) {
      r->closest = sVar1;
    }
    cVar2 = lookup_result::unresolved(r);
    if ((cVar2.len == 0) || (cVar2.str == (char *)0x0)) break;
    if (sVar1 == 0xffffffffffffffff) {
      return;
    }
  }
  r->target = sVar1;
  return;
}

Assistant:

void Tree::_lookup_path_modify(lookup_result *r)
{
    C4_ASSERT( ! r->unresolved().empty());
    _lookup_path_token parent{"", type(r->closest)};
    size_t node;
    do
    {
        node = _next_node_modify(r, &parent);
        if(node != NONE)
            r->closest = node;
        if(r->unresolved().empty())
        {
            r->target = node;
            return;
        }
    } while(node != NONE);
}